

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O0

uint8_t * svb_decode_avx_simple(uint32_t *out,uint8_t *keyPtr,uint8_t *dataPtr,uint64_t count)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint8_t *puVar4;
  ulong in_RCX;
  long in_RSI;
  uint8_t **ppuVar5;
  uint32_t *in_RDI;
  xmm_t alVar6;
  xmm_t Vec;
  xmm_t Vec_00;
  xmm_t Vec_01;
  xmm_t Vec_02;
  xmm_t Vec_03;
  xmm_t Vec_04;
  xmm_t Vec_05;
  xmm_t Vec_06;
  xmm_t Vec_07;
  xmm_t Vec_08;
  xmm_t Vec_09;
  xmm_t Vec_10;
  xmm_t Vec_11;
  xmm_t Vec_12;
  xmm_t Vec_13;
  uint64_t consumedkeys;
  uint64_t keys_1;
  uint64_t keys;
  uint64_t nextkeys;
  uint64_t *keyPtr64;
  int64_t Offset;
  xmm_t Data;
  uint64_t keybytes;
  undefined8 in_stack_ffffffffffffffa0;
  uint32_t count_00;
  uint8_t *in_stack_ffffffffffffffa8;
  uint8_t *in_stack_ffffffffffffffb0;
  uint8_t *puVar7;
  uint32_t *in_stack_ffffffffffffffb8;
  long local_40;
  uint8_t *local_18 [2];
  uint32_t *local_8;
  
  count_00 = (uint32_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_8 = in_RDI;
  if (7 < in_RCX >> 2) {
    local_40 = (long)-(in_RCX >> 2) / 8 + 1;
    in_stack_ffffffffffffffb8 = (uint32_t *)(in_RSI + local_40 * -8);
    puVar4 = *(uint8_t **)(in_stack_ffffffffffffffb8 + local_40 * 2);
    for (; local_40 != 0; local_40 = local_40 + 1) {
      puVar7 = *(uint8_t **)(in_stack_ffffffffffffffb8 + local_40 * 2 + 2);
      ppuVar5 = local_18;
      alVar6 = _decode_avx((uint)puVar4 & 0xff,ppuVar5);
      Vec[1] = alVar6[1];
      Vec[0] = (longlong)ppuVar5;
      _write_avx(local_8,Vec);
      ppuVar5 = local_18;
      alVar6 = _decode_avx((uint)((ulong)puVar4 >> 8) & 0xff,ppuVar5);
      Vec_00[1] = alVar6[1];
      Vec_00[0] = (longlong)ppuVar5;
      _write_avx(local_8 + 4,Vec_00);
      uVar2 = (ulong)puVar4 >> 0x10;
      ppuVar5 = local_18;
      alVar6 = _decode_avx((uint)((ulong)puVar4 >> 0x10) & 0xff,ppuVar5);
      Vec_01[1] = alVar6[1];
      Vec_01[0] = (longlong)ppuVar5;
      _write_avx(local_8 + 8,Vec_01);
      ppuVar5 = local_18;
      alVar6 = _decode_avx((uint)(uVar2 >> 8) & 0xff,ppuVar5);
      Vec_02[1] = alVar6[1];
      Vec_02[0] = (longlong)ppuVar5;
      _write_avx(local_8 + 0xc,Vec_02);
      uVar3 = uVar2 >> 0x10;
      ppuVar5 = local_18;
      alVar6 = _decode_avx((uint)(uVar2 >> 0x10) & 0xff,ppuVar5);
      Vec_03[1] = alVar6[1];
      Vec_03[0] = (longlong)ppuVar5;
      _write_avx(local_8 + 0x10,Vec_03);
      ppuVar5 = local_18;
      alVar6 = _decode_avx((uint)(uVar3 >> 8) & 0xff,ppuVar5);
      Vec_04[1] = alVar6[1];
      Vec_04[0] = (longlong)ppuVar5;
      _write_avx(local_8 + 0x14,Vec_04);
      in_stack_ffffffffffffffa8 = (uint8_t *)(uVar3 >> 0x10);
      ppuVar5 = local_18;
      alVar6 = _decode_avx((uint)(uVar3 >> 0x10) & 0xff,ppuVar5);
      Vec_05[1] = alVar6[1];
      Vec_05[0] = (longlong)ppuVar5;
      _write_avx(local_8 + 0x18,Vec_05);
      ppuVar5 = local_18;
      alVar6 = _decode_avx((uint)((ulong)in_stack_ffffffffffffffa8 >> 8) & 0xff,ppuVar5);
      Vec_06[1] = alVar6[1];
      Vec_06[0] = (longlong)ppuVar5;
      _write_avx(local_8 + 0x1c,Vec_06);
      local_8 = local_8 + 0x20;
      puVar4 = puVar7;
    }
    ppuVar5 = local_18;
    in_stack_ffffffffffffffb0 = puVar4;
    alVar6 = _decode_avx((uint)puVar4 & 0xff,ppuVar5);
    alVar6[0] = (longlong)ppuVar5;
    _write_avx(local_8,alVar6);
    ppuVar5 = local_18;
    alVar6 = _decode_avx((uint)((ulong)puVar4 >> 8) & 0xff,ppuVar5);
    Vec_07[1] = alVar6[1];
    Vec_07[0] = (longlong)ppuVar5;
    _write_avx(local_8 + 4,Vec_07);
    ppuVar5 = local_18;
    alVar6 = _decode_avx((uint)((ulong)puVar4 >> 0x10) & 0xff,ppuVar5);
    Vec_08[1] = alVar6[1];
    Vec_08[0] = (longlong)ppuVar5;
    _write_avx(local_8 + 8,Vec_08);
    ppuVar5 = local_18;
    alVar6 = _decode_avx((uint)((ulong)puVar4 >> 0x18) & 0xff,ppuVar5);
    Vec_09[1] = alVar6[1];
    Vec_09[0] = (longlong)ppuVar5;
    _write_avx(local_8 + 0xc,Vec_09);
    uVar1 = (uint)((ulong)puVar4 >> 0x20);
    ppuVar5 = local_18;
    alVar6 = _decode_avx(uVar1 & 0xff,ppuVar5);
    Vec_10[1] = alVar6[1];
    Vec_10[0] = (longlong)ppuVar5;
    _write_avx(local_8 + 0x10,Vec_10);
    ppuVar5 = local_18;
    alVar6 = _decode_avx(uVar1 >> 8 & 0xff,ppuVar5);
    Vec_11[1] = alVar6[1];
    Vec_11[0] = (longlong)ppuVar5;
    _write_avx(local_8 + 0x14,Vec_11);
    count_00 = 0;
    ppuVar5 = local_18;
    alVar6 = _decode_avx((ushort)((ulong)puVar4 >> 0x30) & 0xff,ppuVar5);
    Vec_12[1] = alVar6[1];
    Vec_12[0] = (longlong)ppuVar5;
    _write_avx(local_8 + 0x18,Vec_12);
    ppuVar5 = local_18;
    alVar6 = _decode_avx((uint)(byte)((ulong)puVar4 >> 0x38),ppuVar5);
    Vec_13[1] = alVar6[1];
    Vec_13[0] = (longlong)ppuVar5;
    _write_avx(local_8 + 0x1c,Vec_13);
    local_8 = local_8 + 0x20;
  }
  puVar4 = svb_decode_scalar(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                             in_stack_ffffffffffffffa8,count_00);
  return puVar4;
}

Assistant:

uint8_t *svb_decode_avx_simple(uint32_t *out, uint8_t *__restrict__ keyPtr,
                               uint8_t *__restrict__ dataPtr, uint64_t count) {

  uint64_t keybytes = count / 4; // number of key bytes
  xmm_t Data;
  if (keybytes >= 8) {

    int64_t Offset = -(int64_t)keybytes / 8 + 1;

    const uint64_t *keyPtr64 = (const uint64_t *)keyPtr - Offset;
    uint64_t nextkeys = keyPtr64[Offset];
    for (; Offset != 0; ++Offset) {
      uint64_t keys = nextkeys;
      nextkeys = keyPtr64[Offset + 1];

      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 4, Data);

      keys >>= 16;
      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out + 8, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 12, Data);

      keys >>= 16;
      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out + 16, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 20, Data);

      keys >>= 16;
      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out + 24, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 28, Data);

      out += 32;
    }
    {
      uint64_t keys = nextkeys;

      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 4, Data);

      keys >>= 16;
      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out + 8, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 12, Data);

      keys >>= 16;
      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out + 16, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 20, Data);

      keys >>= 16;
      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out + 24, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 28, Data);

      out += 32;
    }
  }
  uint64_t consumedkeys = keybytes - (keybytes & 7);
  return svb_decode_scalar(out, keyPtr + consumedkeys, dataPtr, count & 31);
}